

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O0

IRIns * aa_findcnew(jit_State *J,IRIns *ir)

{
  IRIns *pIVar1;
  IRIns *in_RSI;
  long in_RDI;
  IRIns *ir1;
  IRIns *local_28;
  IRIns *in_stack_ffffffffffffffe0;
  
  local_28 = in_RSI;
  while( true ) {
    if ((local_28->field_1).o != '(') {
      if ((local_28->field_1).o != 'P') {
        local_28 = (IRIns *)0x0;
      }
      return local_28;
    }
    if (0x7fff < (local_28->field_0).op1) {
      pIVar1 = aa_findcnew((jit_State *)&local_28->field_0,in_stack_ffffffffffffffe0);
      if (pIVar1 != (IRIns *)0x0) {
        return pIVar1;
      }
      in_stack_ffffffffffffffe0 = (IRIns *)0x0;
    }
    if ((local_28->field_0).op2 < 0x8000) break;
    local_28 = (IRIns *)(*(long *)(in_RDI + 0x10) + (ulong)(local_28->field_0).op2 * 8);
  }
  return (IRIns *)0x0;
}

Assistant:

static IRIns *aa_findcnew(jit_State *J, IRIns *ir)
{
  while (ir->o == IR_ADD) {
    if (!irref_isk(ir->op1)) {
      IRIns *ir1 = aa_findcnew(J, IR(ir->op1));  /* Left-recursion. */
      if (ir1) return ir1;
    }
    if (irref_isk(ir->op2)) return NULL;
    ir = IR(ir->op2);  /* Flatten right-recursion. */
  }
  return ir->o == IR_CNEW ? ir : NULL;
}